

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

void server::readent(entity *e,char *buf,int ver)

{
  short sVar1;
  int iVar2;
  
  if ((ver < 0x1f) && ((e->type - 0x19 < 6 || (e->type - 0x14 < 2)))) {
    sVar1 = e->attr1;
    iVar2 = (int)((ulong)((long)(sVar1 + 0xb4) * -0x49f49f49) >> 0x20) + (int)sVar1 + 0xb4;
    e->attr1 = sVar1 + ((short)((uint)iVar2 >> 8) - (short)(iVar2 >> 0x1f)) * -0x168 + 0xb4;
  }
  if ((ver < 0x20) && ((byte)(e->type - 0x1a) < 4)) {
    sVar1 = e->attr1;
    iVar2 = (int)((ulong)((long)sVar1 * -0x49f49f49) >> 0x20) + (int)sVar1;
    e->attr1 = (short)((ulong)(((int)sVar1 + ((iVar2 >> 8) - (iVar2 >> 0x1f)) * -0x168 + 0x168U) %
                               0x168 + 7) * 0x11111112 >> 0x20) * 0xf;
  }
  return;
}

Assistant:

void readent(entity &e, char *buf, int ver) //read from disk, and init
    {
        if(ver <= 30) switch(e.type)
        {
            case FLAG:
            case MONSTER:
            case TELEDEST:
            case RESPAWNPOINT:
            case BOX:
            case BARREL:
            case PLATFORM:
            case ELEVATOR:
                e.attr1 = (int(e.attr1)+180)%360;
                break;
        }
        if(ver <= 31) switch(e.type)
        {
            case BOX:
            case BARREL:
            case PLATFORM:
            case ELEVATOR:
                int yaw = (int(e.attr1)%360 + 360)%360 + 7;
                e.attr1 = yaw - yaw%15;
                break;
        }
    }